

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conc_func_queue_examples.cpp
# Opt level: O0

void density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::
     func_queue_put_samples(ostream *i_ostream)

{
  void **ppvVar1;
  type_conflict tVar2;
  bool bVar3;
  double *pdVar4;
  void *this;
  int *piVar5;
  value_type *pvVar6;
  Func_conflict *pFVar7;
  undefined1 local_2e0 [7];
  bool invoked_2;
  undefined1 local_2b8 [8];
  put_transaction<Func> transaction_1;
  conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
  queue_5;
  undefined1 auStack_250 [7];
  bool invoked_1;
  char *local_248;
  put_transaction<typename_std::decay<Func>::type> local_240;
  undefined1 local_218 [8];
  put_transaction<typename_std::decay<Func>::type> transaction;
  conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
  queue_4;
  undefined1 local_1b0 [3];
  bool invoked;
  conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
  queue_3;
  type return_value_1;
  int sum;
  Struct struct_instance;
  offset_in_Struct_to_int local_158;
  code *local_150;
  undefined8 local_148;
  code *local_140;
  undefined8 local_138;
  undefined1 local_130 [8];
  conc_function_queue<int_(Struct_*),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
  queue_2;
  undefined1 local_f0 [8];
  type return_value;
  undefined1 local_d8 [4];
  int i;
  conc_function_queue<double_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
  queue_1;
  anon_class_8_1_90f47376 func;
  double last_val;
  anon_class_1_0_00000001 local_79;
  undefined1 local_78 [8];
  conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
  queue;
  PrintScopeDuration dur;
  ostream *i_ostream_local;
  
  PrintScopeDuration::PrintScopeDuration
            ((PrintScopeDuration *)&queue.m_queue.m_queue.m_tail,i_ostream,
             "function queue put samples");
  density::
  conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
  ::conc_function_queue
            ((conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
              *)local_78);
  density::
  conc_function_queue<void(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)1>
  ::
  push<density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_put_samples(std::ostream&)::_lambda()_1_>
            ((conc_function_queue<void(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)1>
              *)local_78,&local_79);
  density::
  conc_function_queue<void(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)1>
  ::
  push<density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_put_samples(std::ostream&)::_lambda()_2_>
            ((conc_function_queue<void(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)1>
              *)local_78,(anon_class_1_0_00000001 *)((long)&last_val + 3));
  density::
  conc_function_queue<void(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)1>
  ::
  push<density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_put_samples(std::ostream&)::_lambda()_3_>
            ((conc_function_queue<void(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)1>
              *)local_78,(anon_class_1_0_00000001 *)((long)&last_val + 2));
  density::
  conc_function_queue<void(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)1>
  ::
  push<density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_put_samples(std::ostream&)::_lambda()_4_>
            ((conc_function_queue<void(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)1>
              *)local_78,(anon_class_1_0_00000001 *)((long)&last_val + 1));
  do {
    tVar2 = density::
            conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
            ::try_consume((conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
                           *)local_78);
  } while (tVar2);
  density::
  conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
  ::~conc_function_queue
            ((conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
              *)local_78);
  func.last_val = (double *)0x3ff0000000000000;
  queue_1.m_queue.m_queue.m_tail = (ControlBlock *)&func;
  density::
  conc_function_queue<double_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
  ::conc_function_queue
            ((conc_function_queue<double_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
              *)local_d8);
  for (return_value._12_4_ = 0; (int)return_value._12_4_ < 10;
      return_value._12_4_ = return_value._12_4_ + 1) {
    density::
    conc_function_queue<double(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)1>
    ::
    push<density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_put_samples(std::ostream&)::_lambda()_5_&>
              ((conc_function_queue<double(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)1>
                *)local_d8,(anon_class_8_1_90f47376 *)&queue_1.m_queue.m_queue.m_tail);
  }
  do {
    density::
    conc_function_queue<double_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
    ::try_consume((conc_function_queue<double_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
                   *)local_f0);
    bVar3 = density::builtin_optional::operator_cast_to_bool((builtin_optional *)local_f0);
    if (bVar3) {
      pdVar4 = density::builtin_optional<double>::operator*((builtin_optional<double> *)local_f0);
      this = (void *)std::ostream::operator<<(&std::cout,*pdVar4);
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
      queue_2.m_queue.m_queue.m_tail._4_4_ = 0;
    }
    else {
      queue_2.m_queue.m_queue.m_tail._4_4_ = 8;
    }
    density::builtin_optional<double>::~builtin_optional((builtin_optional<double> *)local_f0);
  } while (queue_2.m_queue.m_queue.m_tail._4_4_ == 0);
  density::
  conc_function_queue<double_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
  ::~conc_function_queue
            ((conc_function_queue<double_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
              *)local_d8);
  density::
  conc_function_queue<int_(Struct_*),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
  ::conc_function_queue
            ((conc_function_queue<int_(Struct_*),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
              *)local_130);
  local_140 = func_queue_put_samples::Struct::func_1;
  local_138 = 0;
  density::
  conc_function_queue<int(density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_put_samples(std::ostream&)::Struct*),density::basic_default_allocator<65536ul>,(density::function_type_erasure)0>
  ::
  push<int(density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_put_samples(std::ostream&)::Struct::*)()>
            ((conc_function_queue<int(density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_put_samples(std::ostream&)::Struct*),density::basic_default_allocator<65536ul>,(density::function_type_erasure)0>
              *)local_130,(offset_in_Struct_to_subr *)&local_140);
  local_150 = func_queue_put_samples::Struct::func_2;
  local_148 = 0;
  density::
  conc_function_queue<int(density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_put_samples(std::ostream&)::Struct*),density::basic_default_allocator<65536ul>,(density::function_type_erasure)0>
  ::
  push<int(density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_put_samples(std::ostream&)::Struct::*)()>
            ((conc_function_queue<int(density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_put_samples(std::ostream&)::Struct*),density::basic_default_allocator<65536ul>,(density::function_type_erasure)0>
              *)local_130,(offset_in_Struct_to_subr *)&local_150);
  local_158 = 0;
  density::
  conc_function_queue<int(density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_put_samples(std::ostream&)::Struct*),density::basic_default_allocator<65536ul>,(density::function_type_erasure)0>
  ::
  push<int_density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_put_samples(std::ostream&)::Struct::*>
            ((conc_function_queue<int(density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_put_samples(std::ostream&)::Struct*),density::basic_default_allocator<65536ul>,(density::function_type_erasure)0>
              *)local_130,&local_158);
  struct_instance.var_1 = 4;
  struct_instance.var_2 = 0;
  density::
  conc_function_queue<int(density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_put_samples(std::ostream&)::Struct*),density::basic_default_allocator<65536ul>,(density::function_type_erasure)0>
  ::
  push<int_density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_put_samples(std::ostream&)::Struct::*>
            ((conc_function_queue<int(density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_put_samples(std::ostream&)::Struct*),density::basic_default_allocator<65536ul>,(density::function_type_erasure)0>
              *)local_130,(offset_in_Struct_to_int *)&struct_instance);
  func_queue_put_samples::Struct::Struct((Struct *)&return_value_1.m_has_value);
  return_value_1.m_storage = (type)0x0;
  do {
    density::
    conc_function_queue<int_(Struct_*),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
    ::try_consume((conc_function_queue<int_(Struct_*),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
                   *)((long)&queue_3.m_queue.m_queue.m_tail + 4),(Struct *)local_130);
    bVar3 = density::builtin_optional::operator_cast_to_bool
                      ((builtin_optional *)((long)&queue_3.m_queue.m_queue.m_tail + 4));
    if (bVar3) {
      piVar5 = density::builtin_optional<int>::operator*
                         ((builtin_optional<int> *)((long)&queue_3.m_queue.m_queue.m_tail + 4));
      return_value_1.m_storage.__data = *piVar5 + return_value_1.m_storage.__data;
      queue_2.m_queue.m_queue.m_tail._4_4_ = 0;
    }
    else {
      queue_2.m_queue.m_queue.m_tail._4_4_ = 10;
    }
    density::builtin_optional<int>::~builtin_optional
              ((builtin_optional<int> *)((long)&queue_3.m_queue.m_queue.m_tail + 4));
  } while (queue_2.m_queue.m_queue.m_tail._4_4_ == 0);
  if (return_value_1.m_storage != (type)0xa) {
    __assert_fail("sum == 10",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_func_queue_examples.cpp"
                  ,0x5c,
                  "static void density_tests::ConcFunctionQueueSamples<density::function_manual_clear>::func_queue_put_samples(std::ostream &) [ERASURE = density::function_manual_clear]"
                 );
  }
  density::
  conc_function_queue<int_(Struct_*),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
  ::~conc_function_queue
            ((conc_function_queue<int_(Struct_*),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
              *)local_130);
  density::
  conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
  ::conc_function_queue
            ((conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
              *)local_1b0);
  queue_4.m_queue.m_queue.m_tail._4_4_ = 7;
  density::
  conc_function_queue<void(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)1>
  ::
  emplace<density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_put_samples(std::ostream&)::Func,int>
            ((conc_function_queue<void(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)1>
              *)local_1b0,(int *)((long)&queue_4.m_queue.m_queue.m_tail + 4));
  queue_4.m_queue.m_queue.m_tail._3_1_ =
       density::
       conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
       ::try_consume((conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
                      *)local_1b0);
  if (!(bool)queue_4.m_queue.m_queue.m_tail._3_1_) {
    __assert_fail("invoked",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_func_queue_examples.cpp"
                  ,0x7e,
                  "static void density_tests::ConcFunctionQueueSamples<density::function_manual_clear>::func_queue_put_samples(std::ostream &) [ERASURE = density::function_manual_clear]"
                 );
  }
  density::
  conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
  ::~conc_function_queue
            ((conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
              *)local_1b0);
  ppvVar1 = &transaction.m_put_transaction.m_put_data.m_user_storage;
  density::
  conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
  ::conc_function_queue
            ((conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
              *)ppvVar1);
  _auStack_250 = (char *)0x0;
  local_248 = (char *)0x0;
  density::
  conc_function_queue<void(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)1>
  ::
  start_push<density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_put_samples(std::ostream&)::Func>
            (&local_240,
             (conc_function_queue<void(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)1>
              *)ppvVar1,(Func_conflict *)auStack_250);
  density::
  conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>>
  ::
  put_transaction<density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_put_samples(std::ostream&)::Func>
  ::
  put_transaction<density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_put_samples(std::ostream&)::Func,void>
            ((put_transaction<density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_put_samples(std::ostream&)::Func>
              *)local_218,&local_240);
  density::
  conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
  ::put_transaction<Func>::~put_transaction(&local_240);
  pvVar6 = density::
           conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
           ::put_transaction<Func>::raw_allocate_copy<char[12]>
                     ((put_transaction<Func> *)local_218,(char (*) [12])"Hello world");
  pFVar7 = density::
           conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
           ::put_transaction<Func>::element<Func,_nullptr>((put_transaction<Func> *)local_218);
  pFVar7->m_string_1 = pvVar6;
  pvVar6 = density::
           conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
           ::put_transaction<Func>::raw_allocate_copy<char[18]>
                     ((put_transaction<Func> *)local_218,(char (*) [18])"\t(I\'m so happy)!!");
  pFVar7 = density::
           conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
           ::put_transaction<Func>::element<Func,_nullptr>((put_transaction<Func> *)local_218);
  pFVar7->m_string_2 = pvVar6;
  density::
  conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
  ::put_transaction<Func>::commit((put_transaction<Func> *)local_218);
  tVar2 = density::
          conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
          ::try_consume((conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
                         *)&transaction.m_put_transaction.m_put_data.m_user_storage);
  if (!tVar2) {
    __assert_fail("invoked",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_func_queue_examples.cpp"
                  ,0x9b,
                  "static void density_tests::ConcFunctionQueueSamples<density::function_manual_clear>::func_queue_put_samples(std::ostream &) [ERASURE = density::function_manual_clear]"
                 );
  }
  density::
  conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
  ::put_transaction<Func>::~put_transaction((put_transaction<Func> *)local_218);
  density::
  conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
  ::~conc_function_queue
            ((conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
              *)&transaction.m_put_transaction.m_put_data.m_user_storage);
  ppvVar1 = &transaction_1.m_put_transaction.m_put_data.m_user_storage;
  density::
  conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
  ::conc_function_queue
            ((conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
              *)ppvVar1);
  density::
  conc_function_queue<void(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)1>
  ::
  start_emplace<density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_put_samples(std::ostream&)::Func>
            ((put_transaction<Func> *)local_2e0,
             (conc_function_queue<void(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)1>
              *)ppvVar1);
  density::
  conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>>
  ::
  put_transaction<density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_put_samples(std::ostream&)::Func>
  ::
  put_transaction<density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_put_samples(std::ostream&)::Func,void>
            ((put_transaction<density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_put_samples(std::ostream&)::Func>
              *)local_2b8,(put_transaction<Func> *)local_2e0);
  density::
  conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
  ::put_transaction<Func>::~put_transaction((put_transaction<Func> *)local_2e0);
  pvVar6 = density::
           conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
           ::put_transaction<Func>::raw_allocate_copy<char[12]>
                     ((put_transaction<Func> *)local_2b8,(char (*) [12])"Hello world");
  pFVar7 = density::
           conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
           ::put_transaction<Func>::element<Func,_nullptr>((put_transaction<Func> *)local_2b8);
  pFVar7->m_string_1 = pvVar6;
  pvVar6 = density::
           conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
           ::put_transaction<Func>::raw_allocate_copy<char[18]>
                     ((put_transaction<Func> *)local_2b8,(char (*) [18])"\t(I\'m so happy)!!");
  pFVar7 = density::
           conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
           ::put_transaction<Func>::element<Func,_nullptr>((put_transaction<Func> *)local_2b8);
  pFVar7->m_string_2 = pvVar6;
  density::
  conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
  ::put_transaction<Func>::commit((put_transaction<Func> *)local_2b8);
  tVar2 = density::
          conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
          ::try_consume((conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
                         *)&transaction_1.m_put_transaction.m_put_data.m_user_storage);
  if (!tVar2) {
    __assert_fail("invoked",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_func_queue_examples.cpp"
                  ,0xb8,
                  "static void density_tests::ConcFunctionQueueSamples<density::function_manual_clear>::func_queue_put_samples(std::ostream &) [ERASURE = density::function_manual_clear]"
                 );
  }
  density::
  conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
  ::put_transaction<Func>::~put_transaction((put_transaction<Func> *)local_2b8);
  density::
  conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
  ::~conc_function_queue
            ((conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
              *)&transaction_1.m_put_transaction.m_put_data.m_user_storage);
  PrintScopeDuration::~PrintScopeDuration((PrintScopeDuration *)&queue.m_queue.m_queue.m_tail);
  return;
}

Assistant:

static void func_queue_put_samples(std::ostream & i_ostream)
        {
            PrintScopeDuration dur(i_ostream, "function queue put samples");

            using namespace density;

            {
                //! [conc_function_queue push example 1]
                conc_function_queue<void(), default_allocator, ERASURE> queue;
                queue.push([] { std::cout << "Hello"; });
                queue.push([] { std::cout << " world"; });
                queue.push([] { std::cout << "!!!"; });
                queue.push([] { std::cout << std::endl; });
                while (queue.try_consume())
                    ;
                //! [conc_function_queue push example 1]
            }
            {
                //! [conc_function_queue push example 2]
                double last_val = 1.;

                auto func = [&last_val] { return last_val /= 2.; };

                conc_function_queue<double(), default_allocator, ERASURE> queue;
                for (int i = 0; i < 10; i++)
                    queue.push(func);

                while (auto const return_value = queue.try_consume())
                    std::cout << *return_value << std::endl;
                //! [conc_function_queue push example 2]
            }
            {
                //! [conc_function_queue push example 3]
#if !defined(_MSC_VER) || !defined(_M_X64) /* the size of a type must always be a multiple of
        the alignment, but in the Microsoft's compiler, on 64-bit targets, pointers to data
        member are 4 bytes big, but are aligned to 8 bytes.

        Test code:
            using T = int Struct::*;
            std::cout << sizeof(T) << std::endl;
            std::cout << alignof(T) << std::endl;
        */

                struct Struct
                {
                    int func_1() { return 1; }
                    int func_2() { return 2; }
                    int var_1 = 3;
                    int var_2 = 4;
                };

                conc_function_queue<int(Struct *)> queue;
                queue.push(&Struct::func_1);
                queue.push(&Struct::func_2);
                queue.push(&Struct::var_1);
                queue.push(&Struct::var_2);

                Struct struct_instance;

                int sum = 0;
                while (auto const return_value = queue.try_consume(&struct_instance))
                    sum += *return_value;
                assert(sum == 10);

#endif
//! [conc_function_queue push example 3]
#if !defined(_MSC_VER) || !defined(_M_X64)
                (void)sum;
#endif
            }
            {
                //! [conc_function_queue emplace example 1]
                /* This local struct is unmovable and uncopyable, so emplace is the only
                    option to add it to the queue. Note that operator () returns an int,
                    but we add it to a void() function queue. This is ok, as we are just
                    discarding the return value. */
                struct Func
                {
                    int const m_value;

                    Func(int i_value) : m_value(i_value) {}

                    Func(const Func &) = delete;
                    Func & operator=(const Func &) = delete;

                    int operator()() const
                    {
                        std::cout << m_value << std::endl;
                        return m_value;
                    }
                };

                conc_function_queue<void(), default_allocator, ERASURE> queue;
                queue.template emplace<Func>(7);

                bool const invoked = queue.try_consume();
                assert(invoked);
                //! [conc_function_queue emplace example 1]
                (void)invoked;
            }
            {
                //! [conc_function_queue start_push example 1]
                struct Func
                {
                    const char * m_string_1;
                    const char * m_string_2;

                    void operator()()
                    {
                        std::cout << m_string_1 << std::endl;
                        std::cout << m_string_2 << std::endl;
                    }
                };

                conc_function_queue<void(), default_allocator, ERASURE> queue;
                auto transaction = queue.start_push(Func{});

                // in case of exception here, since the transaction is not committed, it is discarded with no observable effects
                transaction.element().m_string_1 = transaction.raw_allocate_copy("Hello world");
                transaction.element().m_string_2 =
                  transaction.raw_allocate_copy("\t(I'm so happy)!!");

                transaction.commit();

                bool const invoked = queue.try_consume();
                assert(invoked);
                //! [conc_function_queue start_push example 1]
                (void)invoked;
            }
            {
                //! [conc_function_queue start_emplace example 1]
                struct Func
                {
                    const char * m_string_1;
                    const char * m_string_2;

                    void operator()()
                    {
                        std::cout << m_string_1 << std::endl;
                        std::cout << m_string_2 << std::endl;
                    }
                };

                conc_function_queue<void(), default_allocator, ERASURE> queue;
                auto transaction = queue.template start_emplace<Func>();

                // in case of exception here, since the transaction is not committed, it is discarded with no observable effects
                transaction.element().m_string_1 = transaction.raw_allocate_copy("Hello world");
                transaction.element().m_string_2 =
                  transaction.raw_allocate_copy("\t(I'm so happy)!!");

                transaction.commit();

                bool const invoked = queue.try_consume();
                assert(invoked);
                //! [conc_function_queue start_emplace example 1]
                (void)invoked;
            }
        }